

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall
benchmark::State::State(State *this,size_t max_iters,bool has_x,int x,bool has_y,int y,int thread_i)

{
  bool bVar1;
  ostream *local_58;
  CheckHandler local_30;
  int local_28;
  undefined1 local_21;
  int y_local;
  bool has_y_local;
  int x_local;
  bool has_x_local;
  size_t max_iters_local;
  State *this_local;
  
  this->started_ = false;
  this->total_iterations_ = 0;
  this->has_range_x_ = has_x;
  this->range_x_ = x;
  this->has_range_y_ = has_y;
  this->range_y_ = y;
  this->bytes_processed_ = 0;
  this->items_processed_ = 0;
  this->thread_index = thread_i;
  this->max_iterations = max_iters;
  bVar1 = this->max_iterations == 0;
  local_28 = y;
  local_21 = has_y;
  y_local = x;
  has_y_local = has_x;
  _x_local = max_iters;
  max_iters_local = (size_t)this;
  if (bVar1) {
    internal::CheckHandler::CheckHandler
              (&local_30,"max_iterations != 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
               ,"State",0x2eb);
    local_58 = internal::CheckHandler::GetLog(&local_30);
  }
  else {
    local_58 = internal::GetNullLogInstance();
  }
  std::operator<<(local_58,"At least one iteration must be run");
  if (!bVar1) {
    return;
  }
  internal::CheckHandler::~CheckHandler(&local_30);
}

Assistant:

State::State(size_t max_iters, bool has_x, int x, bool has_y, int y,
             int thread_i)
    : started_(false), total_iterations_(0),
      has_range_x_(has_x), range_x_(x),
      has_range_y_(has_y), range_y_(y),
      bytes_processed_(0), items_processed_(0),
      thread_index(thread_i),
      max_iterations(max_iters)
{
    CHECK(max_iterations != 0) << "At least one iteration must be run";
}